

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O2

PackageSymbol *
slang::ast::PackageSymbol::fromSyntax
          (Scope *scope,ModuleDeclarationSyntax *syntax,NetType *defaultNetType,
          optional<slang::TimeScale> directiveTimeScale)

{
  not_null<slang::syntax::ModuleHeaderSyntax_*> *this;
  pointer ppMVar1;
  SyntaxKind SVar2;
  Compilation *args;
  MemberSyntax *this_00;
  size_type sVar3;
  _Optional_payload_base<slang::ast::VariableLifetime> _Var4;
  Token token;
  int iVar5;
  ModuleHeaderSyntax *pMVar6;
  _Optional_payload_base<slang::ast::VariableLifetime> _Var7;
  PackageSymbol *this_01;
  TimeUnitsDeclarationSyntax *syntax_00;
  PackageExportDeclarationSyntax *pPVar8;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_02;
  bool isFirst;
  pointer ppMVar9;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  iterator __begin5;
  PackageImportItemSyntax *item;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL> exportDecls;
  
  args = scope->compilation;
  this = &syntax->header;
  pMVar6 = not_null<slang::syntax::ModuleHeaderSyntax_*>::get(this);
  token.kind = (pMVar6->lifetime).kind;
  token._2_1_ = (pMVar6->lifetime).field_0x2;
  token.numFlags.raw = (pMVar6->lifetime).numFlags.raw;
  token.rawLen = (pMVar6->lifetime).rawLen;
  token.info = (pMVar6->lifetime).info;
  _Var7 = (_Optional_payload_base<slang::ast::VariableLifetime>)
          SemanticFacts::getVariableLifetime(token);
  pMVar6 = not_null<slang::syntax::ModuleHeaderSyntax_*>::get(this);
  exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>._0_16_ =
       parsing::Token::valueText(&pMVar6->name);
  pMVar6 = not_null<slang::syntax::ModuleHeaderSyntax_*>::get(this);
  unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
       parsing::Token::location(&pMVar6->name);
  _Var4._M_payload = (_Storage<slang::ast::VariableLifetime,_true>)0x1;
  _Var4._M_engaged = false;
  _Var4._5_3_ = 0;
  if (((ulong)_Var7 >> 0x20 & 1) != 0) {
    _Var4 = _Var7;
  }
  precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._0_4_ = _Var4._M_payload;
  this_01 = BumpAllocator::
            emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                      (&args->super_BumpAllocator,args,
                       (basic_string_view<char,_std::char_traits<char>_> *)&exportDecls,
                       (SourceLocation *)&unitsRange,defaultNetType,
                       (VariableLifetime *)&precisionRange);
  (this_01->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_01 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&this_01->super_Symbol,scope,syntax_01);
  exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>.len = 0;
  exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>.data_ =
       (pointer)exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>.
                firstElement;
  unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
  precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
  exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>.cap = 5;
  ppMVar9 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            data_;
  ppMVar1 = ppMVar9 + (syntax->members).
                      super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  isFirst = true;
  src = extraout_RDX;
  do {
    if (ppMVar9 == ppMVar1) {
      iVar5 = SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::copy
                        (&exportDecls.
                          super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>,
                         (EVP_PKEY_CTX *)args,src);
      (this_01->exportDecls).data_ = (pointer)CONCAT44(extraout_var,iVar5);
      (this_01->exportDecls).size_ = extraout_RDX_02;
      SemanticFacts::populateTimeScale
                (&this_01->timeScale,scope,directiveTimeScale,
                 unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::SourceRange>._M_engaged,
                 precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::SourceRange>._M_engaged);
      SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::~SmallVectorBase
                (&exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>)
      ;
      return this_01;
    }
    this_00 = *ppMVar9;
    SVar2 = (this_00->super_SyntaxNode).kind;
    if (SVar2 == PackageExportAllDeclaration) {
      this_01->hasExportAll = true;
LAB_0032eb8b:
      Scope::addMembers(&this_01->super_Scope,&this_00->super_SyntaxNode);
      isFirst = false;
      src = extraout_RDX_01;
    }
    else {
      if (SVar2 == PackageExportDeclaration) {
        pPVar8 = slang::syntax::SyntaxNode::as<slang::syntax::PackageExportDeclarationSyntax>
                           (&this_00->super_SyntaxNode);
        __begin5.index = 0;
        sVar3 = (pPVar8->items).elements.size_;
        __begin5.list = &pPVar8->items;
        for (; (__begin5.list != &pPVar8->items || (__begin5.index != sVar3 + 1 >> 1));
            __begin5.index = __begin5.index + 1) {
          item = slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::
                 iterator_base<slang::syntax::PackageImportItemSyntax_*>::operator*(&__begin5);
          SmallVectorBase<slang::syntax::PackageImportItemSyntax_const*>::
          emplace_back<slang::syntax::PackageImportItemSyntax_const*const&>
                    ((SmallVectorBase<slang::syntax::PackageImportItemSyntax_const*> *)&exportDecls,
                     &item);
        }
        goto LAB_0032eb8b;
      }
      if (SVar2 != TimeUnitsDeclaration) goto LAB_0032eb8b;
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::TimeUnitsDeclarationSyntax>
                            (&this_00->super_SyntaxNode);
      SemanticFacts::populateTimeScale
                (&this_01->timeScale,scope,syntax_00,&unitsRange,&precisionRange,isFirst);
      src = extraout_RDX_00;
    }
    ppMVar9 = ppMVar9 + 1;
  } while( true );
}

Assistant:

PackageSymbol& PackageSymbol::fromSyntax(const Scope& scope, const ModuleDeclarationSyntax& syntax,
                                         const NetType& defaultNetType,
                                         std::optional<TimeScale> directiveTimeScale) {
    auto& comp = scope.getCompilation();
    auto lifetime = SemanticFacts::getVariableLifetime(syntax.header->lifetime);
    auto result = comp.emplace<PackageSymbol>(comp, syntax.header->name.valueText(),
                                              syntax.header->name.location(), defaultNetType,
                                              lifetime.value_or(VariableLifetime::Static));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;
    SmallVector<const PackageImportItemSyntax*> exportDecls;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            SemanticFacts::populateTimeScale(result->timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;

        if (member->kind == SyntaxKind::PackageExportAllDeclaration) {
            result->hasExportAll = true;
        }
        else if (member->kind == SyntaxKind::PackageExportDeclaration) {
            for (auto item : member->as<PackageExportDeclarationSyntax>().items)
                exportDecls.push_back(item);
        }

        result->addMembers(*member);
    }

    result->exportDecls = exportDecls.copy(comp);

    SemanticFacts::populateTimeScale(result->timeScale, scope, directiveTimeScale,
                                     unitsRange.has_value(), precisionRange.has_value());
    return *result;
}